

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

Result<std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>_> * __thiscall
vkb::Swapchain::get_image_views
          (Result<std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>_>
           *__return_storage_ptr__,Swapchain *this,void *pNext)

{
  pointer ppVVar1;
  VkResult VVar2;
  long lVar3;
  size_type __n;
  long lVar4;
  bool bVar5;
  VkImageViewUsageCreateInfo desired_flags;
  Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_> swapchain_images_ret;
  vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> local_e8;
  int local_c8 [2];
  int *piStack_c0;
  ulong local_b8;
  anon_union_24_2_293c120a_for_Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_>_1
  local_a8;
  char local_90;
  VkImageViewCreateInfo local_88;
  
  get_images((Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_> *)&local_a8.m_value,
             this);
  if (local_90 == '\x01') {
    if (pNext == (void *)0x0) {
      pNext = (int *)0x0;
      bVar5 = false;
    }
    else {
      do {
        bVar5 = *pNext == 0xf;
        if (bVar5) goto LAB_00109b6b;
        pNext = *(void **)((long)pNext + 8);
      } while ((int *)pNext != (int *)0x0);
      pNext = (int *)0x0;
    }
LAB_00109b6b:
    local_c8[0] = 0x3b9c930a;
    local_c8[1] = 0;
    local_b8 = (ulong)this->image_usage_flags;
    ppVVar1 = (pointer)CONCAT44(local_a8._4_4_,local_a8.m_error.type._M_value);
    __n = (long)local_a8.m_value.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1 >> 3;
    piStack_c0 = (int *)pNext;
    std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>::vector
              (&local_e8,__n,(allocator_type *)&local_88);
    if (local_a8.m_value.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
        super__Vector_impl_data._M_finish != (pointer)ppVVar1) {
      lVar4 = __n + (__n == 0);
      lVar3 = 0;
      do {
        local_88.flags = 0;
        local_88._20_4_ = 0;
        local_88.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
        local_88._4_4_ = 0;
        local_88.pNext = local_c8;
        if (this->instance_version < 0x401000) {
          local_88.pNext = pNext;
        }
        if (bVar5) {
          local_88.pNext = pNext;
        }
        local_88.image = *(VkImage *)((long)ppVVar1 + lVar3);
        local_88.format = this->image_format;
        local_88.viewType = VK_IMAGE_VIEW_TYPE_2D;
        local_88.components.r = VK_COMPONENT_SWIZZLE_IDENTITY;
        local_88.components.g = VK_COMPONENT_SWIZZLE_IDENTITY;
        local_88.components.b = VK_COMPONENT_SWIZZLE_IDENTITY;
        local_88.components.a = VK_COMPONENT_SWIZZLE_IDENTITY;
        local_88.subresourceRange.aspectMask = 1;
        local_88.subresourceRange.baseMipLevel = 0;
        local_88.subresourceRange.levelCount = 1;
        local_88.subresourceRange.baseArrayLayer = 0;
        local_88.subresourceRange.layerCount = 1;
        local_88._76_4_ = 0;
        VVar2 = (*(this->internal_table).fp_vkCreateImageView)
                          (this->device,&local_88,this->allocation_callbacks,
                           (VkImageView *)
                           ((long)local_e8.
                                  super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar3));
        if (VVar2 != VK_SUCCESS) {
          (__return_storage_ptr__->field_0).m_error.type._M_value = 4;
          (__return_storage_ptr__->field_0).m_value.
          super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)&detail::swapchain_error_category;
          (__return_storage_ptr__->field_0).m_error.vk_result = VVar2;
          __return_storage_ptr__->m_init = false;
          if (local_e8.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl
              .super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e8.
                            super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_e8.
                                  super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_e8.
                                  super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          goto LAB_00109cec;
        }
        lVar3 = lVar3 + 8;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    (__return_storage_ptr__->field_0).m_value.
    super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_e8.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->field_0).m_value.
    super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_e8.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->field_0).m_value.
    super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_e8.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    __return_storage_ptr__->m_init = true;
    if (ppVVar1 != (pointer)0x0) {
LAB_00109cec:
      operator_delete(ppVVar1,(long)local_a8.m_value.
                                    super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppVVar1);
    }
  }
  else {
    (__return_storage_ptr__->field_0).m_error.type._M_value = local_a8.m_error.type._M_value;
    (__return_storage_ptr__->field_0).m_value.
    super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)local_a8.m_value.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
    __return_storage_ptr__->m_init = false;
  }
  return __return_storage_ptr__;
}

Assistant:

Result<std::vector<VkImageView>> Swapchain::get_image_views(const void* pNext) {
    const auto swapchain_images_ret = get_images();
    if (!swapchain_images_ret) return swapchain_images_ret.error();
    const auto& swapchain_images = swapchain_images_ret.value();

    bool already_contains_image_view_usage = false;
    while (pNext) {
        if (reinterpret_cast<const VkBaseInStructure*>(pNext)->sType == VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO) {
            already_contains_image_view_usage = true;
            break;
        }
        pNext = reinterpret_cast<const VkBaseInStructure*>(pNext)->pNext;
    }
    VkImageViewUsageCreateInfo desired_flags{};
    desired_flags.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_USAGE_CREATE_INFO;
    desired_flags.pNext = pNext;
    desired_flags.usage = image_usage_flags;

    std::vector<VkImageView> views(swapchain_images.size());
    for (size_t i = 0; i < swapchain_images.size(); i++) {
        VkImageViewCreateInfo createInfo = {};
        createInfo.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
        if (instance_version >= VKB_VK_API_VERSION_1_1 && !already_contains_image_view_usage) {
            createInfo.pNext = &desired_flags;
        } else {
            createInfo.pNext = pNext;
        }

        createInfo.image = swapchain_images[i];
        createInfo.viewType = VK_IMAGE_VIEW_TYPE_2D;
        createInfo.format = image_format;
        createInfo.components.r = VK_COMPONENT_SWIZZLE_IDENTITY;
        createInfo.components.g = VK_COMPONENT_SWIZZLE_IDENTITY;
        createInfo.components.b = VK_COMPONENT_SWIZZLE_IDENTITY;
        createInfo.components.a = VK_COMPONENT_SWIZZLE_IDENTITY;
        createInfo.subresourceRange.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
        createInfo.subresourceRange.baseMipLevel = 0;
        createInfo.subresourceRange.levelCount = 1;
        createInfo.subresourceRange.baseArrayLayer = 0;
        createInfo.subresourceRange.layerCount = 1;
        VkResult res = internal_table.fp_vkCreateImageView(device, &createInfo, allocation_callbacks, &views[i]);
        if (res != VK_SUCCESS) return Error{ SwapchainError::failed_create_swapchain_image_views, res };
    }
    return views;
}